

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# char_property.h
# Opt level: O3

void __thiscall MeCab::CharProperty::~CharProperty(CharProperty *this)

{
  pointer pcVar1;
  pointer ppcVar2;
  Mmap<char> *pMVar3;
  int in_ESI;
  
  this->_vptr_CharProperty = (_func_int **)&PTR__CharProperty_00140080;
  close(this,in_ESI);
  pcVar1 = (this->what_).str_._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->what_).str_.field_2) {
    operator_delete(pcVar1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&this->what_);
  std::ios_base::~ios_base((ios_base *)&(this->what_).field_0x70);
  ppcVar2 = (this->clist_).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppcVar2 != (pointer)0x0) {
    operator_delete(ppcVar2);
  }
  (this->cmmap_)._vptr_scoped_ptr = (_func_int **)&PTR__scoped_ptr_001400b0;
  pMVar3 = (this->cmmap_).ptr_;
  if (pMVar3 != (Mmap<char> *)0x0) {
    (*pMVar3->_vptr_Mmap[1])();
    return;
  }
  return;
}

Assistant:

virtual ~CharProperty() { this->close(); }